

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::transformed_abi_cxx11_(lest *this,char chr)

{
  Tr *pTVar1;
  char cVar2;
  bool local_113;
  allocator local_111;
  string local_110 [39];
  byte local_e9;
  lest local_e8 [32];
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  Tr **local_70;
  Tr *pos;
  Tr table [5];
  char chr_local;
  
  table[4].str._7_1_ = chr;
  memcpy(&pos,&DAT_001dcd30,0x50);
  local_70 = &pos;
  while( true ) {
    if (local_70 == (Tr **)&table[4].str) {
      local_113 = unprintable(table[4].str._7_1_);
      cVar2 = table[4].str._7_1_;
      local_e9 = 0;
      if (local_113) {
        to_hex_string_abi_cxx11_(local_e8,table[4].str._7_1_);
        local_e9 = 1;
        std::__cxx11::string::string(local_c8,(string *)local_e8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_110,1,cVar2,&local_111);
        std::__cxx11::string::string(local_c8,local_110);
      }
      local_113 = !local_113;
      std::__cxx11::string::string((string *)this,local_c8);
      std::__cxx11::string::~string(local_c8);
      if (local_113) {
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
      if ((local_e9 & 1) != 0) {
        std::__cxx11::string::~string((string *)local_e8);
      }
      return this;
    }
    if (table[4].str._7_1_ == *(char *)local_70) break;
    local_70 = local_70 + 2;
  }
  pTVar1 = local_70[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,&pTVar1->chr,&local_91);
  std::__cxx11::string::string((string *)this,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return this;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}